

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O2

int nn_port_resolve(char *port,size_t portlen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = 0;
  sVar3 = 0;
  while( true ) {
    if (portlen == sVar3) {
      iVar1 = -0x16;
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
      return iVar1;
    }
    if ((byte)(port[sVar3] - 0x3aU) < 0xf6) break;
    iVar2 = (uint)(byte)(port[sVar3] - 0x30) + iVar2 * 10;
    sVar3 = sVar3 + 1;
    if (0xffff < iVar2) {
      return -0x16;
    }
  }
  return -0x16;
}

Assistant:

int nn_port_resolve (const char *port, size_t portlen)
{
    int res;
    size_t i;

    res = 0;
    for (i = 0; i != portlen; ++i) {
        if (port [i] < '0' || port [i] > '9')
            return -EINVAL;
        res *= 10;
        res += port [i] - '0';
        if (res > 0xffff)
            return -EINVAL;
    }

    /*  Port 0 has special meaning (assign an ephemeral port to the socket),
        thus it is illegal to use it in the connection string. */
    if (res == 0)
        return -EINVAL;

    return res;
}